

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.hpp
# Opt level: O1

void __thiscall
tcu::TextureFormatInfo::TextureFormatInfo
          (TextureFormatInfo *this,Vec4 *valueMin_,Vec4 *valueMax_,Vec4 *lookupScale_,
          Vec4 *lookupBias_)

{
  int i;
  long lVar1;
  
  lVar1 = 0;
  do {
    (this->valueMin).m_data[lVar1] = valueMin_->m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  lVar1 = 0;
  do {
    (this->valueMax).m_data[lVar1] = valueMax_->m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  lVar1 = 0;
  do {
    (this->lookupScale).m_data[lVar1] = lookupScale_->m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  lVar1 = 0;
  do {
    (this->lookupBias).m_data[lVar1] = lookupBias_->m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  return;
}

Assistant:

TextureFormatInfo (const Vec4& valueMin_, const Vec4& valueMax_, const Vec4& lookupScale_, const Vec4& lookupBias_)
		: valueMin		(valueMin_)
		, valueMax		(valueMax_)
		, lookupScale	(lookupScale_)
		, lookupBias	(lookupBias_)
	{
	}